

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttpost.c
# Opt level: O1

FT_Error load_post_names(TT_Face face)

{
  FT_Stream stream;
  long lVar1;
  byte bVar2;
  FT_UShort FVar3;
  FT_Error FVar4;
  uint extraout_EAX;
  FT_ULong FVar5;
  FT_Byte *pFVar6;
  FT_Byte *buffer;
  undefined7 extraout_var;
  uint uVar7;
  uint uVar8;
  int iVar9;
  FT_Memory pFVar10;
  ushort uVar11;
  uint uVar12;
  ulong uVar13;
  ulong uVar14;
  FT_Byte *pFVar15;
  FT_ULong local_70;
  FT_ULong post_len;
  ulong local_60;
  FT_Memory local_58;
  FT_Byte *local_50;
  FT_Byte *local_48;
  FT_Byte *local_40;
  FT_UShort local_36;
  uint local_34;
  
  stream = (face->root).stream;
  FVar4 = (*face->goto_table)(face,0x706f7374,stream,&local_70);
  if (FVar4 != 0) {
    return FVar4;
  }
  FVar5 = FT_Stream_Pos(stream);
  pFVar15 = (FT_Byte *)(FVar5 + local_70);
  lVar1 = (face->postscript).FormatType;
  FVar4 = FT_Stream_Skip(stream,0x20);
  if (FVar4 != 0) {
    return FVar4;
  }
  if (lVar1 != 0x25000) {
    uVar8 = 3;
    if (lVar1 != 0x20000) goto LAB_0021ff07;
    pFVar10 = stream->memory;
    FVar3 = FT_Stream_ReadUShort(stream,(FT_Error *)&local_34);
    uVar8 = local_34;
    if (local_34 != 0) goto LAB_0021ff07;
    if ((face->max_profile).numGlyphs < FVar3) goto LAB_0021fedb;
    uVar14 = (ulong)FVar3;
    local_58 = pFVar10;
    local_36 = FVar3;
    pFVar6 = (FT_Byte *)ft_mem_realloc(pFVar10,2,0,uVar14,(void *)0x0,(FT_Error *)&local_34);
    iVar9 = 3;
    uVar8 = (uint)&local_34;
    if ((local_34 == 0) &&
       (local_48 = pFVar6, local_34 = FT_Stream_EnterFrame(stream,(ulong)((uint)FVar3 * 2)),
       pFVar6 = local_48, uVar8 = local_34, local_34 == 0)) {
      if (local_36 != 0) {
        uVar13 = 0;
        do {
          FVar3 = FT_Stream_GetUShort(stream);
          *(FT_UShort *)(local_48 + uVar13 * 2) = FVar3;
          uVar13 = uVar13 + 1;
        } while (uVar14 != uVar13);
      }
      FT_Stream_ExitFrame(stream);
      iVar9 = 0;
      pFVar6 = local_48;
      uVar8 = extraout_EAX;
    }
    if (iVar9 != 3) {
      if (iVar9 != 0) goto LAB_0021ff07;
      if (local_36 == 0) {
        local_60 = 0;
      }
      else {
        uVar13 = 0;
        uVar8 = 0;
        do {
          uVar12 = *(ushort *)(pFVar6 + uVar13 * 2) - 0x101;
          uVar7 = uVar8 & 0xffff;
          if ((int)uVar12 <= (int)uVar7) {
            uVar12 = uVar7;
          }
          uVar8 = uVar12;
          if (*(ushort *)(pFVar6 + uVar13 * 2) < 0x102) {
            uVar8 = uVar7;
          }
          local_60 = (ulong)uVar8;
          uVar13 = uVar13 + 1;
        } while (uVar14 != uVar13);
      }
      uVar11 = (ushort)local_60;
      local_60 = local_60 & 0xffff;
      local_48 = pFVar6;
      buffer = (FT_Byte *)ft_mem_realloc(local_58,8,0,local_60,(void *)0x0,(FT_Error *)&local_34);
      iVar9 = 3;
      local_40 = buffer;
      if ((local_34 == 0) && (iVar9 = 0, uVar11 != 0)) {
        uVar14 = 0;
        do {
          buffer = (FT_Byte *)FT_Stream_Pos(stream);
          iVar9 = 10;
          if (buffer < pFVar15) {
            bVar2 = FT_Stream_ReadChar(stream,(FT_Error *)&local_34);
            buffer = (FT_Byte *)CONCAT71(extraout_var,bVar2);
            iVar9 = 0xf;
            if (local_34 == 0) {
              pFVar6 = (FT_Byte *)(ulong)bVar2;
              if ((pFVar15 < pFVar6) ||
                 (post_len = (long)pFVar15 - (long)pFVar6, local_50 = pFVar6,
                 FVar5 = FT_Stream_Pos(stream), post_len < FVar5)) {
                FVar5 = FT_Stream_Pos(stream);
                uVar8 = (int)pFVar15 - (int)FVar5;
                local_50 = (FT_Byte *)(ulong)uVar8;
                if ((int)uVar8 < 1) {
                  local_50 = (FT_Byte *)0x0;
                }
              }
              buffer = (FT_Byte *)
                       ft_mem_realloc(local_58,1,0,(ulong)((int)local_50 + 1),(void *)0x0,
                                      (FT_Error *)&local_34);
              *(FT_Byte **)(local_40 + uVar14 * 8) = buffer;
              if (local_34 == 0) {
                local_50 = (FT_Byte *)((ulong)local_50 & 0xffffffff);
                local_34 = FT_Stream_Read(stream,buffer,(FT_ULong)local_50);
                buffer = (FT_Byte *)(ulong)local_34;
                iVar9 = 0xf;
                if (local_34 == 0) {
                  buffer = *(FT_Byte **)(local_40 + uVar14 * 8);
                  buffer[(long)local_50] = '\0';
                  iVar9 = 0;
                }
              }
              else {
                iVar9 = 0xf;
              }
            }
          }
          if (iVar9 != 0) {
            if (iVar9 != 10) goto LAB_0021ffac;
            if ((ushort)uVar14 < uVar11) {
              goto LAB_00220145;
            }
            break;
          }
          uVar14 = uVar14 + 1;
        } while (local_60 != uVar14);
        iVar9 = 0;
      }
      goto LAB_0021ffac;
    }
    pFVar15 = (FT_Byte *)0x0;
    goto LAB_0021fee7;
  }
  pFVar10 = stream->memory;
  FVar3 = FT_Stream_ReadUShort(stream,(FT_Error *)&local_34);
  uVar8 = local_34;
  if (local_34 != 0) goto LAB_0021ff07;
  uVar14 = (ulong)FVar3;
  if ((0x102 < FVar3) || ((face->max_profile).numGlyphs <= (ushort)(FVar3 - 1))) {
LAB_0021fedb:
    local_34 = 3;
    uVar8 = local_34;
    goto LAB_0021ff07;
  }
  pFVar6 = (FT_Byte *)ft_mem_realloc(pFVar10,1,0,uVar14,(void *)0x0,(FT_Error *)&local_34);
  if (local_34 == 0) {
    local_34 = FT_Stream_Read(stream,pFVar6,uVar14);
    uVar13 = (ulong)local_34;
    if (local_34 == 0) {
      if (FVar3 != 0) {
        uVar13 = 0;
        do {
          if (uVar14 < (long)(char)pFVar6[uVar13] + uVar13) {
            local_34 = 3;
            iVar9 = 3;
            goto LAB_0021ff52;
          }
          uVar13 = uVar13 + 1;
        } while (uVar14 != uVar13);
      }
      iVar9 = 0;
LAB_0021ff52:
      if (iVar9 != 3) {
        uVar8 = (uint)uVar13;
        if (iVar9 != 0) goto LAB_0021ff07;
        (face->postscript_names).names.format_20.num_glyphs = FVar3;
        (face->postscript_names).names.format_25.offsets = (FT_Char *)pFVar6;
        goto LAB_0022012b;
      }
    }
  }
  goto LAB_0021feff;
  while( true ) {
    *buffer = '\0';
    uVar14 = uVar14 + 1;
    iVar9 = 0;
    if (local_60 <= uVar14) break;
LAB_00220145:
    buffer = (FT_Byte *)ft_mem_realloc(local_58,1,0,1,(void *)0x0,(FT_Error *)&local_34);
    *(FT_Byte **)(local_40 + uVar14 * 8) = buffer;
    if (local_34 != 0) {
      iVar9 = 0xf;
      break;
    }
  }
LAB_0021ffac:
  pFVar15 = local_40;
  pFVar10 = local_58;
  uVar14 = local_60;
  if (iVar9 == 0) {
    (face->postscript_names).names.format_20.num_glyphs = local_36;
    (face->postscript_names).names.format_20.num_names = uVar11;
    (face->postscript_names).names.format_25.offsets = (FT_Char *)local_48;
    *(FT_Byte **)((long)&(face->postscript_names).names + 0x10) = local_40;
LAB_0022012b:
    uVar8 = 0;
    goto LAB_0021ff07;
  }
  pFVar6 = local_48;
  if (iVar9 == 0xf) {
    if (uVar11 != 0) {
      uVar13 = 0;
      do {
        ft_mem_free(pFVar10,*(void **)(pFVar15 + uVar13 * 8));
        pFVar6 = pFVar15 + uVar13 * 8;
        pFVar6[0] = '\0';
        pFVar6[1] = '\0';
        pFVar6[2] = '\0';
        pFVar6[3] = '\0';
        pFVar6[4] = '\0';
        pFVar6[5] = '\0';
        pFVar6[6] = '\0';
        pFVar6[7] = '\0';
        uVar13 = uVar13 + 1;
        pFVar6 = local_48;
      } while (uVar14 != uVar13);
    }
  }
  else {
    uVar8 = (uint)buffer;
    if (iVar9 != 3) goto LAB_0021ff07;
  }
LAB_0021fee7:
  pFVar10 = local_58;
  ft_mem_free(local_58,pFVar15);
LAB_0021feff:
  ft_mem_free(pFVar10,pFVar6);
  uVar8 = local_34;
LAB_0021ff07:
  (face->postscript_names).loaded = '\x01';
  return uVar8;
}

Assistant:

static FT_Error
  load_post_names( TT_Face  face )
  {
    FT_Stream  stream;
    FT_Error   error;
    FT_Fixed   format;
    FT_ULong   post_len;
    FT_ULong   post_limit;


    /* get a stream for the face's resource */
    stream = face->root.stream;

    /* seek to the beginning of the PS names table */
    error = face->goto_table( face, TTAG_post, stream, &post_len );
    if ( error )
      goto Exit;

    post_limit = FT_STREAM_POS() + post_len;

    format = face->postscript.FormatType;

    /* go to beginning of subtable */
    if ( FT_STREAM_SKIP( 32 ) )
      goto Exit;

    /* now read postscript table */
    if ( format == 0x00020000L )
      error = load_format_20( face, stream, post_limit );
    else if ( format == 0x00025000L )
      error = load_format_25( face, stream, post_limit );
    else
      error = FT_THROW( Invalid_File_Format );

    face->postscript_names.loaded = 1;

  Exit:
    return error;
  }